

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-eintr-handling.c
# Opt level: O2

int run_test_eintr_handling(void)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  undefined8 uStackY_e0;
  uv_thread_t thread;
  thread_ctx ctx;
  uv_signal_t signal;
  
  iov = (uv_buf_t)uv_buf_init(buf,0x20);
  loop = (uv_loop_t *)uv_default_loop();
  iVar1 = uv_signal_init(loop,&signal);
  if (iVar1 == 0) {
    iVar1 = uv_signal_start(&signal,sig_func,10);
    if (iVar1 == 0) {
      iVar1 = pipe(pipe_fds);
      if (iVar1 == 0) {
        iVar1 = uv_thread_create(&thread,thread_main,&ctx);
        if (iVar1 == 0) {
          iVar1 = uv_fs_read(loop,&read_req,pipe_fds[0],&iov,1,0xffffffffffffffff,0);
          if (iVar1 == 0xd) {
            iVar1 = strcmp(buf,test_buf);
            if (iVar1 == 0) {
              iVar1 = uv_run(loop,0);
              if (iVar1 == 0) {
                iVar1 = close(pipe_fds[0]);
                if (iVar1 == 0) {
                  iVar1 = close(pipe_fds[1]);
                  if (iVar1 == 0) {
                    uv_close(&signal,0);
                    uVar2 = uv_default_loop();
                    uv_walk(uVar2,close_walk_cb,0);
                    uv_run(uVar2,0);
                    uVar2 = uv_default_loop();
                    iVar1 = uv_loop_close(uVar2);
                    if (iVar1 == 0) {
                      return 0;
                    }
                    pcVar3 = "0 == uv_loop_close(uv_default_loop())";
                    uStackY_e0 = 0x5a;
                  }
                  else {
                    pcVar3 = "0 == close(pipe_fds[1])";
                    uStackY_e0 = 0x57;
                  }
                }
                else {
                  pcVar3 = "0 == close(pipe_fds[0])";
                  uStackY_e0 = 0x56;
                }
              }
              else {
                pcVar3 = "0 == uv_run(loop, UV_RUN_DEFAULT)";
                uStackY_e0 = 0x54;
              }
            }
            else {
              pcVar3 = "0 == strcmp(buf, test_buf)";
              uStackY_e0 = 0x52;
            }
          }
          else {
            pcVar3 = "nread == sizeof(test_buf)";
            uStackY_e0 = 0x51;
          }
        }
        else {
          pcVar3 = "0 == uv_thread_create(&thread, thread_main, &ctx)";
          uStackY_e0 = 0x4d;
        }
      }
      else {
        pcVar3 = "0 == pipe(pipe_fds)";
        uStackY_e0 = 0x4c;
      }
    }
    else {
      pcVar3 = "0 == uv_signal_start(&signal, sig_func, SIGUSR1)";
      uStackY_e0 = 0x4a;
    }
  }
  else {
    pcVar3 = "0 == uv_signal_init(loop, &signal)";
    uStackY_e0 = 0x49;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-eintr-handling.c"
          ,uStackY_e0,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(eintr_handling) {
  struct thread_ctx ctx;
  uv_thread_t thread;
  uv_signal_t signal;
  int nread;

  iov = uv_buf_init(buf, sizeof(buf));
  loop = uv_default_loop();

  ASSERT(0 == uv_signal_init(loop, &signal));
  ASSERT(0 == uv_signal_start(&signal, sig_func, SIGUSR1));

  ASSERT(0 == pipe(pipe_fds));
  ASSERT(0 == uv_thread_create(&thread, thread_main, &ctx));

  nread = uv_fs_read(loop, &read_req, pipe_fds[0], &iov, 1, -1, NULL);

  ASSERT(nread == sizeof(test_buf));
  ASSERT(0 == strcmp(buf, test_buf));

  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));

  ASSERT(0 == close(pipe_fds[0]));
  ASSERT(0 == close(pipe_fds[1]));
  uv_close((uv_handle_t*) &signal, NULL);

  MAKE_VALGRIND_HAPPY();
  return 0;
}